

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlines.cpp
# Opt level: O1

void skiwi::inline_is_input_port(asmcode *code,compiler_options *param_2)

{
  skiwi *psVar1;
  uint64_t in_RDX;
  uint64_t lab;
  string lab_false;
  string done;
  operation local_68 [3];
  operand local_5c [3];
  string local_50;
  string local_30;
  
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&local_50,psVar1,in_RDX);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&local_30,psVar1,lab);
  jump_short_if_arg_is_not_block(code,RAX,RBX,&local_50);
  local_5c[2] = 2;
  local_5c[1] = 9;
  local_5c[0] = NUMBER;
  local_68[0] = ~CMPLTPD;
  local_68[1] = ~ADD;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_5c + 2,local_5c + 1,local_5c,(unsigned_long *)local_68);
  jump_short_if_arg_does_not_point_to_port(code,RAX,RBX,&local_50);
  local_68[0] = MOV;
  local_5c[2] = 9;
  local_5c[1] = 0x19;
  local_5c[0] = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_68,local_5c + 2,local_5c + 1,(int *)local_5c);
  local_68[0] = JMPS;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_68,&local_30);
  local_68[0] = LABEL;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_68,&local_50);
  local_68[0] = MOV;
  local_5c[2] = 9;
  local_5c[1] = 0x39;
  local_5c[0] = DL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_68,local_5c + 2,local_5c + 1,(int *)local_5c);
  local_68[0] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_68,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void inline_is_input_port(ASM::asmcode& code, const compiler_options&)
  {
  auto lab_false = label_to_string(label++);
  auto done = label_to_string(label++);
  jump_short_if_arg_is_not_block(code, ASM::asmcode::RAX, ASM::asmcode::RBX, lab_false);
  code.add(ASM::asmcode::AND, ASM::asmcode::RAX, ASM::asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  jump_short_if_arg_does_not_point_to_port(code, ASM::asmcode::RAX, ASM::asmcode::RBX, lab_false);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ASM::asmcode::MEM_RAX, CELLS(1));
  code.add(ASM::asmcode::JMPS, done);
  code.add(ASM::asmcode::LABEL, lab_false);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ASM::asmcode::NUMBER, bool_f);
  code.add(ASM::asmcode::LABEL, done);
  }